

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_priority.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::decay_target_priority(raft_server *this)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  element_type *peVar4;
  long in_RDI;
  int32 prev_priority;
  int gap;
  timer_helper *in_stack_ffffffffffffffb0;
  string local_40 [32];
  int local_20 [3];
  int local_14 [5];
  
  local_14[1] = 10;
  local_14[0] = *(int *)(in_RDI + 0x40) / 5;
  piVar3 = std::max<int>(local_14 + 1,local_14);
  local_14[2] = *piVar3;
  local_20[2] = *(uint *)(in_RDI + 0x40);
  local_20[1] = 1;
  local_20[0] = *(int *)(in_RDI + 0x40) - local_14[2];
  piVar3 = std::max<int>(local_20 + 1,local_20);
  *(int *)(in_RDI + 0x40) = *piVar3;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1eb510);
    iVar2 = (**(code **)(*(long *)peVar4 + 0x38))();
    if (3 < iVar2) {
      peVar4 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1eb533);
      msg_if_given_abi_cxx11_
                ((char *)local_40,"[PRIORITY] decay, target %d -> %d, mine %d",
                 (ulong)(uint)local_20[2],(ulong)*(uint *)(in_RDI + 0x40),
                 (ulong)*(uint *)(in_RDI + 0x3c));
      (**(code **)(*(long *)peVar4 + 0x40))
                (peVar4,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_priority.cxx"
                 ,"decay_target_priority",0xd6,local_40);
      std::__cxx11::string::~string(local_40);
    }
  }
  if (1 < local_20[2]) {
    timer_helper::reset(in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void raft_server::decay_target_priority() {
    // Gap should be bigger than 10.
    int gap = std::max((int)10, target_priority_ / 5);

    // Should be bigger than 0.
    int32 prev_priority = target_priority_;
    target_priority_ = std::max(1, target_priority_ - gap);
    p_in("[PRIORITY] decay, target %d -> %d, mine %d",
         prev_priority, target_priority_, my_priority_);

    // Once `target_priority_` becomes 1,
    // `priority_change_timer_` starts ticking.
    if (prev_priority > 1) priority_change_timer_.reset();
}